

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

vm_obj_id_t CVmObjFile::get_charset_arg(int argn,int argc)

{
  int in_ESI;
  int in_EDI;
  char csname [32];
  vm_obj_id_t obj;
  undefined1 *charset_name_len;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  vm_obj_id_t local_c;
  
  local_c = 0;
  if (in_EDI < in_ESI) {
    local_c = CVmBif::get_charset_obj(0);
  }
  if (local_c == 0) {
    os_get_charmap((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
    charset_name_len = &stack0xffffffffffffffc8;
    strlen(&stack0xffffffffffffffc8);
    local_c = CVmObjCharSet::create
                        (in_stack_ffffffffffffffd4,
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (size_t)charset_name_len);
  }
  return local_c;
}

Assistant:

vm_obj_id_t CVmObjFile::get_charset_arg(VMG_ int argn, int argc)
{
    /* presume we won't find a valid argument value */
    vm_obj_id_t obj = VM_INVALID_OBJ;

    /* if there's an argument, pop it */
    if (argn < argc)
        obj = CVmBif::get_charset_obj(vmg_ argn);
    
    /* if we don't have a character set yet, create the default */
    if (obj == VM_INVALID_OBJ)
    {
        /* get the default local character set for file contents */
        char csname[32];
        os_get_charmap(csname, OS_CHARMAP_FILECONTENTS);
        
        /* create the mapper */
        obj = CVmObjCharSet::create(vmg_ FALSE, csname, strlen(csname));
    }

    /* return the character set */
    return obj;
}